

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  undefined8 uVar2;
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  PrimRefMB *pPVar6;
  bool bVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  BBox1f *pBVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  size_t *psVar20;
  long lVar21;
  undefined4 uVar22;
  int iVar23;
  long lVar24;
  size_t sVar25;
  int iVar26;
  long lVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  float fVar47;
  float fVar48;
  undefined1 auVar46 [16];
  float fVar49;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar50;
  float fVar55;
  float fVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar52;
  undefined1 auVar53 [16];
  float fVar57;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  undefined1 auVar59 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar60;
  undefined1 auVar61 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar62;
  undefined1 auVar63 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar64;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong local_220;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  unsigned_long local_1e0;
  size_t local_1d8;
  size_t local_1c0;
  ulong local_170;
  anon_class_16_2_07cfa4d6 local_168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar51 [64];
  undefined1 auVar54 [64];
  
  aVar50.m128[2] = INFINITY;
  aVar50._0_8_ = 0x7f8000007f800000;
  aVar50.m128[3] = INFINITY;
  auVar51 = ZEXT1664((undefined1  [16])aVar50);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar50;
  aVar52.m128[2] = -INFINITY;
  aVar52._0_8_ = 0xff800000ff800000;
  aVar52.m128[3] = -INFINITY;
  auVar54 = ZEXT1664((undefined1  [16])aVar52);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar52;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar50;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar52;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar50;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar52;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar29._8_4_ = 0x3f800000;
  auVar29._0_8_ = &DAT_3f8000003f800000;
  auVar29._12_4_ = 0x3f800000;
  uVar2 = vmovlps_avx(auVar29);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar2;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar18 = r->_begin;
  local_1d8 = __return_storage_ptr__->num_time_segments;
  local_220 = __return_storage_ptr__->max_num_time_segments;
  auVar30._0_4_ = (__return_storage_ptr__->max_time_range).lower;
  auVar30._4_4_ = (__return_storage_ptr__->max_time_range).upper;
  auVar30._8_4_ = (__return_storage_ptr__->time_range).lower;
  auVar30._12_4_ = (__return_storage_ptr__->time_range).upper;
  auVar45 = ZEXT1664(auVar30);
  aVar64 = aVar50;
  aVar62 = aVar52;
  aVar60 = aVar50;
  aVar58 = aVar52;
  if (uVar18 < r->_end) {
    local_1e0 = (__return_storage_ptr__->object_range)._end;
    auVar66 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar65 = ZEXT1664((undefined1  [16])aVar50);
    auVar63 = ZEXT1664((undefined1  [16])aVar52);
    auVar61 = ZEXT1664((undefined1  [16])aVar50);
    auVar59 = ZEXT1664((undefined1  [16])aVar52);
    local_1c0 = k;
    do {
      BVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar39._8_8_ = 0;
      auVar39._0_4_ = BVar3.lower;
      auVar39._4_4_ = BVar3.upper;
      fVar33 = BVar3.lower;
      auVar30 = vmovshdup_avx(auVar39);
      fVar43 = auVar30._0_4_ - fVar33;
      uVar14 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar18);
      pBVar4 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               vertices.items;
      if ((ulong)(uVar14 + 3) < (pBVar4->super_RawBufferView).num) {
        fVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.fnumTimeSegments;
        auVar30 = ZEXT416((uint)(fVar1 * ((t0t1->lower - fVar33) / fVar43) * 1.0000002));
        auVar30 = vroundss_avx(auVar30,auVar30,9);
        auVar30 = vmaxss_avx(auVar66._0_16_,auVar30);
        uVar16 = (uint)auVar30._0_4_;
        auVar30 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar33) / fVar43) * 0.99999976));
        auVar30 = vroundss_avx(auVar30,auVar30,10);
        auVar30 = vminss_avx(auVar30,ZEXT416((uint)fVar1));
        uVar19 = (uint)auVar30._0_4_;
        bVar7 = uVar19 < uVar16;
        if (uVar16 <= uVar19) {
          uVar17 = (ulong)(int)uVar16;
          psVar20 = &pBVar4[uVar17].super_RawBufferView.stride;
          do {
            pcVar5 = ((RawBufferView *)(psVar20 + -2))->ptr_ofs;
            sVar25 = *psVar20;
            lVar21 = sVar25 * (uVar14 + 1);
            lVar27 = sVar25 * (uVar14 + 2);
            lVar24 = sVar25 * (uVar14 + 3);
            auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + sVar25 * uVar14 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar21 + 0xc)),0x10);
            auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar5 + lVar27 + 0xc)),0x20);
            auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar5 + lVar24 + 0xc)),0x30);
            auVar40._8_4_ = 0xddccb9a2;
            auVar40._0_8_ = 0xddccb9a2ddccb9a2;
            auVar40._12_4_ = 0xddccb9a2;
            auVar36._8_4_ = 0x7fffffff;
            auVar36._0_8_ = 0x7fffffff7fffffff;
            auVar36._12_4_ = 0x7fffffff;
            auVar30 = vandps_avx(auVar30,auVar36);
            auVar37._8_4_ = 0x5dccb9a2;
            auVar37._0_8_ = 0x5dccb9a25dccb9a2;
            auVar37._12_4_ = 0x5dccb9a2;
            auVar30 = vcmpps_avx(auVar30,auVar37,5);
            if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar30[0xf] < '\0') {
LAB_012ee503:
              if (!bVar7) goto LAB_012eea47;
              break;
            }
            auVar30 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar25 * uVar14),auVar40,6);
            auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar25 * uVar14),auVar37,1);
            auVar30 = vandps_avx(auVar30,auVar29);
            uVar22 = vmovmskps_avx(auVar30);
            if ((~(byte)uVar22 & 7) != 0) goto LAB_012ee503;
            auVar30 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar21),auVar40,6);
            auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar21),auVar37,1);
            auVar30 = vandps_avx(auVar30,auVar29);
            uVar22 = vmovmskps_avx(auVar30);
            if ((~(byte)uVar22 & 7) != 0) goto LAB_012ee503;
            auVar30 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar27),auVar40,6);
            auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar27),auVar37,1);
            auVar30 = vandps_avx(auVar30,auVar29);
            uVar22 = vmovmskps_avx(auVar30);
            if ((~(byte)uVar22 & 7) != 0) goto LAB_012ee503;
            auVar30 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar24),auVar40,6);
            auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar24),auVar37,1);
            auVar30 = vandps_avx(auVar30,auVar29);
            uVar22 = vmovmskps_avx(auVar30);
            if ((~(byte)uVar22 & 7) != 0) goto LAB_012ee503;
            uVar17 = uVar17 + 1;
            psVar20 = psVar20 + 7;
            bVar7 = (ulong)(long)(int)uVar19 < uVar17;
          } while (uVar17 <= (ulong)(long)(int)uVar19);
        }
        local_118 = auVar65._0_16_;
        local_108 = auVar63._0_16_;
        local_f8 = auVar61._0_16_;
        local_e8 = auVar59._0_16_;
        local_d8 = auVar45._0_16_;
        local_c8 = auVar54._0_16_;
        local_b8 = auVar51._0_16_;
        local_168.primID = &local_170;
        fVar43 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.lower;
        fVar28 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.upper - fVar43;
        fVar32 = (t0t1->lower - fVar43) / fVar28;
        fVar28 = (t0t1->upper - fVar43) / fVar28;
        fVar43 = fVar1 * fVar32;
        fVar33 = fVar1 * fVar28;
        auVar39 = vroundss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),9);
        auVar36 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),10);
        auVar30 = vmaxss_avx(auVar39,auVar66._0_16_);
        auVar29 = vminss_avx(auVar36,ZEXT416((uint)fVar1));
        iVar23 = (int)auVar30._0_4_;
        fVar35 = auVar29._0_4_;
        uVar14 = (int)auVar39._0_4_;
        if ((int)auVar39._0_4_ < 0) {
          uVar14 = 0xffffffff;
        }
        iVar26 = (int)fVar1 + 1;
        if ((int)auVar36._0_4_ < (int)fVar1 + 1) {
          iVar26 = (int)auVar36._0_4_;
        }
        pBVar15 = t0t1;
        local_170 = uVar18;
        local_168.this = this;
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_138.field_1,&local_168,(long)iVar23);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_158.field_1,&local_168,(long)(int)fVar35);
        fVar43 = fVar43 - auVar30._0_4_;
        if (iVar26 - uVar14 == 1) {
          auVar30 = vmaxss_avx(ZEXT416((uint)fVar43),ZEXT816(0) << 0x40);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar53._0_4_ = auVar29._0_4_ * local_158.m128[0] + auVar30._0_4_ * local_138.m128[0];
          auVar53._4_4_ = auVar29._4_4_ * local_158.m128[1] + auVar30._4_4_ * local_138.m128[1];
          auVar53._8_4_ = auVar29._8_4_ * local_158.m128[2] + auVar30._8_4_ * local_138.m128[2];
          auVar53._12_4_ = auVar29._12_4_ * local_158.m128[3] + auVar30._12_4_ * local_138.m128[3];
          auVar46._0_4_ = auVar29._0_4_ * local_148 + auVar30._0_4_ * local_128;
          auVar46._4_4_ = auVar29._4_4_ * fStack_144 + auVar30._4_4_ * fStack_124;
          auVar46._8_4_ = auVar29._8_4_ * fStack_140 + auVar30._8_4_ * fStack_120;
          auVar46._12_4_ = auVar29._12_4_ * fStack_13c + auVar30._12_4_ * fStack_11c;
          auVar30 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar33)),ZEXT816(0) << 0x40);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar34._0_4_ = auVar30._0_4_ * local_158.m128[0] + auVar29._0_4_ * local_138.m128[0];
          auVar34._4_4_ = auVar30._4_4_ * local_158.m128[1] + auVar29._4_4_ * local_138.m128[1];
          auVar34._8_4_ = auVar30._8_4_ * local_158.m128[2] + auVar29._8_4_ * local_138.m128[2];
          auVar34._12_4_ = auVar30._12_4_ * local_158.m128[3] + auVar29._12_4_ * local_138.m128[3];
          auVar41._0_4_ = auVar30._0_4_ * local_148 + auVar29._0_4_ * local_128;
          auVar41._4_4_ = auVar30._4_4_ * fStack_144 + auVar29._4_4_ * fStack_124;
          auVar41._8_4_ = auVar30._8_4_ * fStack_140 + auVar29._8_4_ * fStack_120;
          auVar41._12_4_ = auVar30._12_4_ * fStack_13c + auVar29._12_4_ * fStack_11c;
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_168,(long)(iVar23 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_168,(long)((int)fVar35 + -1));
          auVar30 = vmaxss_avx(ZEXT416((uint)fVar43),ZEXT816(0) << 0x40);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar53._0_4_ = auVar29._0_4_ * local_58.m128[0] + auVar30._0_4_ * local_138.m128[0];
          auVar53._4_4_ = auVar29._4_4_ * local_58.m128[1] + auVar30._4_4_ * local_138.m128[1];
          auVar53._8_4_ = auVar29._8_4_ * local_58.m128[2] + auVar30._8_4_ * local_138.m128[2];
          auVar53._12_4_ = auVar29._12_4_ * local_58.m128[3] + auVar30._12_4_ * local_138.m128[3];
          auVar46._0_4_ = auVar29._0_4_ * local_48 + auVar30._0_4_ * local_128;
          auVar46._4_4_ = auVar29._4_4_ * fStack_44 + auVar30._4_4_ * fStack_124;
          auVar46._8_4_ = auVar29._8_4_ * fStack_40 + auVar30._8_4_ * fStack_120;
          auVar46._12_4_ = auVar29._12_4_ * fStack_3c + auVar30._12_4_ * fStack_11c;
          auVar30 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar33)),ZEXT816(0) << 0x40);
          auVar29 = vshufps_avx(auVar30,auVar30,0);
          auVar30 = ZEXT416((uint)(1.0 - auVar30._0_4_));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar34._0_4_ = auVar29._0_4_ * local_78.m128[0] + auVar30._0_4_ * local_158.m128[0];
          auVar34._4_4_ = auVar29._4_4_ * local_78.m128[1] + auVar30._4_4_ * local_158.m128[1];
          auVar34._8_4_ = auVar29._8_4_ * local_78.m128[2] + auVar30._8_4_ * local_158.m128[2];
          auVar34._12_4_ = auVar29._12_4_ * local_78.m128[3] + auVar30._12_4_ * local_158.m128[3];
          auVar41._0_4_ = auVar29._0_4_ * local_68 + auVar30._0_4_ * local_148;
          auVar41._4_4_ = auVar29._4_4_ * fStack_64 + auVar30._4_4_ * fStack_144;
          auVar41._8_4_ = auVar29._8_4_ * fStack_60 + auVar30._8_4_ * fStack_140;
          auVar41._12_4_ = auVar29._12_4_ * fStack_5c + auVar30._12_4_ * fStack_13c;
          if ((int)(uVar14 + 1) < iVar26) {
            sVar25 = (size_t)(uVar14 + 1);
            iVar26 = ~uVar14 + iVar26;
            do {
              auVar31._0_4_ = ((float)(int)sVar25 / fVar1 - fVar32) / (fVar28 - fVar32);
              auVar31._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar30 = vshufps_avx(auVar31,auVar31,0);
              local_1f8 = auVar34._0_4_;
              fStack_1f4 = auVar34._4_4_;
              fStack_1f0 = auVar34._8_4_;
              fStack_1ec = auVar34._12_4_;
              auVar29 = vshufps_avx(ZEXT416((uint)(1.0 - auVar31._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar31._0_4_)),0);
              fVar55 = auVar53._4_4_;
              fVar56 = auVar53._8_4_;
              fVar57 = auVar53._12_4_;
              fVar43 = auVar41._4_4_;
              fVar33 = auVar41._8_4_;
              fVar35 = auVar41._12_4_;
              fVar47 = auVar46._4_4_;
              fVar48 = auVar46._8_4_;
              fVar49 = auVar46._12_4_;
              local_a8 = auVar41._0_4_ * auVar30._0_4_ + auVar46._0_4_ * auVar29._0_4_;
              fStack_a4 = fVar43 * auVar30._4_4_ + fVar47 * auVar29._4_4_;
              fStack_a0 = fVar33 * auVar30._8_4_ + fVar48 * auVar29._8_4_;
              fStack_9c = fVar35 * auVar30._12_4_ + fVar49 * auVar29._12_4_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_168,sVar25);
              auVar12._4_4_ = auVar30._4_4_ * fStack_1f4 + fVar55 * auVar29._4_4_;
              auVar12._0_4_ = auVar30._0_4_ * local_1f8 + auVar53._0_4_ * auVar29._0_4_;
              auVar12._8_4_ = auVar30._8_4_ * fStack_1f0 + fVar56 * auVar29._8_4_;
              auVar12._12_4_ = auVar30._12_4_ * fStack_1ec + fVar57 * auVar29._12_4_;
              auVar30 = vsubps_avx((undefined1  [16])local_98,auVar12);
              auVar13._4_4_ = fStack_a4;
              auVar13._0_4_ = local_a8;
              auVar13._8_4_ = fStack_a0;
              auVar13._12_4_ = fStack_9c;
              auVar39 = vsubps_avx(local_88,auVar13);
              auVar29 = vminps_avx(auVar30,ZEXT816(0) << 0x40);
              auVar30 = vmaxps_avx(auVar39,ZEXT816(0) << 0x40);
              auVar53._0_4_ = auVar53._0_4_ + auVar29._0_4_;
              auVar53._4_4_ = fVar55 + auVar29._4_4_;
              auVar53._8_4_ = fVar56 + auVar29._8_4_;
              auVar53._12_4_ = fVar57 + auVar29._12_4_;
              auVar34._0_4_ = local_1f8 + auVar29._0_4_;
              auVar34._4_4_ = fStack_1f4 + auVar29._4_4_;
              auVar34._8_4_ = fStack_1f0 + auVar29._8_4_;
              auVar34._12_4_ = fStack_1ec + auVar29._12_4_;
              auVar46._0_4_ = auVar46._0_4_ + auVar30._0_4_;
              auVar46._4_4_ = fVar47 + auVar30._4_4_;
              auVar46._8_4_ = fVar48 + auVar30._8_4_;
              auVar46._12_4_ = fVar49 + auVar30._12_4_;
              auVar41._0_4_ = auVar41._0_4_ + auVar30._0_4_;
              auVar41._4_4_ = fVar43 + auVar30._4_4_;
              auVar41._8_4_ = fVar33 + auVar30._8_4_;
              auVar41._12_4_ = fVar35 + auVar30._12_4_;
              sVar25 = sVar25 + 1;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
        }
        auVar66 = ZEXT1664(ZEXT816(0) << 0x40);
        aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar53,ZEXT416(geomID),0x30);
        uVar14 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 super_Geometry.numTimeSteps - 1;
        uVar17 = (ulong)uVar14;
        aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar46,ZEXT416((uint)uVar18),0x30);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar34,ZEXT416(uVar14),0x30);
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar41,ZEXT416(uVar14),0x30);
        auVar38._0_4_ = aVar8.x * 0.5 + aVar10.x * 0.5 + aVar9.x * 0.5 + aVar11.x * 0.5;
        auVar38._4_4_ = aVar8.y * 0.5 + aVar10.y * 0.5 + aVar9.y * 0.5 + aVar11.y * 0.5;
        auVar38._8_4_ = aVar8.z * 0.5 + aVar10.z * 0.5 + aVar9.z * 0.5 + aVar11.z * 0.5;
        auVar38._12_4_ =
             aVar8.field_3.w * 0.5 + aVar10.field_3.w * 0.5 +
             aVar9.field_3.w * 0.5 + aVar11.field_3.w * 0.5;
        auVar30 = vminps_avx(local_b8,(undefined1  [16])aVar8);
        auVar51 = ZEXT1664(auVar30);
        auVar30 = vmaxps_avx(local_c8,(undefined1  [16])aVar9);
        auVar54 = ZEXT1664(auVar30);
        auVar30 = vminps_avx(local_118,(undefined1  [16])aVar10);
        auVar65 = ZEXT1664(auVar30);
        auVar30 = vmaxps_avx(local_108,(undefined1  [16])aVar11);
        auVar63 = ZEXT1664(auVar30);
        auVar30 = vminps_avx(local_f8,auVar38);
        auVar61 = ZEXT1664(auVar30);
        auVar30 = vmaxps_avx(local_e8,auVar38);
        auVar59 = ZEXT1664(auVar30);
        auVar30 = vshufpd_avx(local_d8,local_d8,1);
        BVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar42._8_4_ = BVar3.lower;
        auVar42._12_4_ = BVar3.upper;
        auVar42._0_4_ = BVar3.lower;
        auVar42._4_4_ = BVar3.upper;
        auVar30 = vcmpps_avx(auVar30,auVar42,1);
        local_1e0 = local_1e0 + 1;
        local_1d8 = local_1d8 + uVar17;
        auVar30 = vshufps_avx(ZEXT416((uint)CONCAT71((int7)((ulong)pBVar15 >> 8),local_220 < uVar17)
                                     ),auVar30,0x40);
        auVar39 = vpslld_avx(auVar30,0x1f);
        auVar44._8_8_ = local_d8._8_8_;
        auVar44._0_4_ = BVar3.lower;
        auVar44._4_4_ = BVar3.upper;
        auVar29 = vshufps_avx(auVar44,auVar44,100);
        auVar30 = vblendps_avx(local_d8,auVar42,4);
        auVar30 = vblendvps_avx(auVar30,auVar29,auVar39);
        auVar45 = ZEXT1664(auVar30);
        if (local_220 <= uVar17) {
          local_220 = uVar17;
        }
        pPVar6 = prims->items;
        pPVar6[local_1c0].lbounds.bounds0.lower.field_0.field_1 = aVar8;
        pPVar6[local_1c0].lbounds.bounds0.upper.field_0.field_1 = aVar9;
        pPVar6[local_1c0].lbounds.bounds1.lower.field_0.field_1 = aVar10;
        pPVar6[local_1c0].lbounds.bounds1.upper.field_0.field_1 = aVar11;
        BVar3 = (BBox1f)vmovlpd_avx(auVar42);
        pPVar6[local_1c0].time_range = BVar3;
        local_1c0 = local_1c0 + 1;
      }
LAB_012eea47:
      auVar30 = auVar45._0_16_;
      aVar52 = auVar54._0_16_;
      aVar50 = auVar51._0_16_;
      uVar18 = uVar18 + 1;
    } while (uVar18 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_1e0;
    aVar64 = auVar65._0_16_;
    aVar62 = auVar63._0_16_;
    aVar60 = auVar61._0_16_;
    aVar58 = auVar59._0_16_;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar50;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar52;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar64;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar62;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar60;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar58;
  __return_storage_ptr__->num_time_segments = local_1d8;
  __return_storage_ptr__->max_num_time_segments = local_220;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar30._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar30._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar30._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar30._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }